

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O2

void __thiscall
wabt::anon_unknown_1::WatWriter::WriteFoldedExprList(WatWriter *this,ExprList *exprs)

{
  FILE *pFVar1;
  bool bVar2;
  Index IVar3;
  Index result_count;
  reference expr;
  SimdLaneOpExpr *pSVar4;
  VarExpr<(wabt::ExprType)45> *pVVar5;
  Exception *pEVar6;
  VarExpr<(wabt::ExprType)9> *pVVar7;
  VarExpr<(wabt::ExprType)11> *pVVar8;
  TryExpr *pTVar9;
  BrTableExpr *pBVar10;
  VarExpr<(wabt::ExprType)8> *pVVar11;
  IfExceptExpr *pIVar12;
  CallIndirectExpr *pCVar13;
  char *pcVar14;
  uint uVar15;
  const_iterator rhs;
  undefined1 local_48 [8];
  const_iterator __begin2;
  
  __begin2.list_ = (intrusive_list<wabt::Expr> *)exprs->first_;
  local_48 = (undefined1  [8])exprs;
LAB_00db20f6:
  rhs.node_ = (Expr *)0x0;
  rhs.list_ = exprs;
  bVar2 = intrusive_list<wabt::Expr>::const_iterator::operator!=((const_iterator *)local_48,rhs);
  if (!bVar2) {
    return;
  }
  expr = intrusive_list<wabt::Expr>::const_iterator::operator*((const_iterator *)local_48);
  pFVar1 = _stderr;
  switch(expr->type_) {
  case AtomicLoad:
  case Convert:
  case Load:
  case MemoryGrow:
  case TeeLocal:
  case Unary:
    goto switchD_00db212b_caseD_0;
  case AtomicRmw:
  case AtomicWake:
  case Binary:
  case Compare:
  case SimdShuffleOp:
switchD_00db212b_caseD_1:
    IVar3 = 2;
    goto LAB_00db21a7;
  case AtomicRmwCmpxchg:
  case AtomicWait:
  case Select:
  case Ternary:
    IVar3 = 3;
    goto LAB_00db21a7;
  case AtomicStore:
  case Store:
    IVar3 = 2;
    goto LAB_00db216c;
  case Block:
    pTVar9 = (TryExpr *)cast<wabt::BlockExprBase<(wabt::ExprType)7>,wabt::Expr>(expr);
    goto LAB_00db22ba;
  case Br:
    pVVar11 = cast<wabt::VarExpr<(wabt::ExprType)8>,wabt::Expr>(expr);
    IVar3 = GetLabelArity(this,&pVVar11->var);
    result_count = 1;
    break;
  case BrIf:
    pVVar7 = cast<wabt::VarExpr<(wabt::ExprType)9>,wabt::Expr>(expr);
    result_count = GetLabelArity(this,&pVVar7->var);
    IVar3 = result_count + 1;
    break;
  case BrTable:
    pBVar10 = cast<wabt::BrTableExpr,wabt::Expr>(expr);
    IVar3 = GetLabelArity(this,&pBVar10->default_target);
    IVar3 = IVar3 + 1;
LAB_00db21a7:
    result_count = 1;
    break;
  case Call:
    pVVar8 = cast<wabt::VarExpr<(wabt::ExprType)11>,wabt::Expr>(expr);
    goto LAB_00db227e;
  case CallIndirect:
    pCVar13 = cast<wabt::CallIndirectExpr,wabt::Expr>(expr);
    goto LAB_00db2331;
  case Const:
  case GetGlobal:
  case GetLocal:
  case MemorySize:
  case Last:
    result_count = 1;
    IVar3 = 0;
    break;
  case Drop:
  case SetGlobal:
  case SetLocal:
    IVar3 = 1;
    goto LAB_00db216c;
  case If:
    pIVar12 = (IfExceptExpr *)cast<wabt::IfExpr,wabt::Expr>(expr);
    goto LAB_00db2302;
  case IfExcept:
    pIVar12 = cast<wabt::IfExceptExpr,wabt::Expr>(expr);
LAB_00db2302:
    result_count = (Index)((ulong)((long)*(pointer *)
                                          ((long)&(pIVar12->true_).decl.sig.result_types.
                                                  super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>
                                                  ._M_impl.super__Vector_impl_data + 8) -
                                  (long)(pIVar12->true_).decl.sig.result_types.
                                        super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                                        _M_impl.super__Vector_impl_data._M_start) >> 2);
    IVar3 = 1;
    break;
  case Loop:
    pTVar9 = (TryExpr *)cast<wabt::BlockExprBase<(wabt::ExprType)22>,wabt::Expr>(expr);
    goto LAB_00db22ba;
  case MemoryCopy:
  case MemoryFill:
  case MemoryInit:
  case TableInit:
  case TableCopy:
    IVar3 = 3;
    goto LAB_00db216c;
  case MemoryDrop:
  case Nop:
  case Rethrow:
  case TableDrop:
    IVar3 = 0;
    goto LAB_00db216c;
  case Return:
    IVar3 = (Index)((ulong)((long)(this->current_func_->decl).sig.result_types.
                                  super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->current_func_->decl).sig.result_types.
                                 super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl
                                 .super__Vector_impl_data._M_start) >> 2);
    result_count = 1;
    break;
  case ReturnCall:
    pVVar8 = (VarExpr<(wabt::ExprType)11> *)cast<wabt::VarExpr<(wabt::ExprType)32>,wabt::Expr>(expr)
    ;
LAB_00db227e:
    __begin2.node_._4_4_ = GetFuncParamCount(this,&pVVar8->var);
    result_count = GetFuncResultCount(this,&pVVar8->var);
    IVar3 = __begin2.node_._4_4_;
    break;
  case ReturnCallIndirect:
    pCVar13 = (CallIndirectExpr *)cast<wabt::ReturnCallIndirectExpr,wabt::Expr>(expr);
LAB_00db2331:
    result_count = (Index)((ulong)((long)(pCVar13->decl).sig.result_types.
                                         super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(pCVar13->decl).sig.result_types.
                                        super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                                        _M_impl.super__Vector_impl_data._M_start) >> 2);
    IVar3 = (int)((ulong)((long)(pCVar13->decl).sig.param_types.
                                super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                         (long)(pCVar13->decl).sig.param_types.
                               super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                               super__Vector_impl_data._M_start) >> 2) + 1;
    break;
  case SimdLaneOp:
    pSVar4 = cast<wabt::SimdLaneOpExpr,wabt::Expr>(expr);
    pFVar1 = _stderr;
    uVar15 = (pSVar4->opcode).enum_ - I8X16ExtractLaneS;
    if (0x12 < uVar15) {
LAB_00db23d1:
      pcVar14 = GetExprTypeName(expr);
      fprintf(pFVar1,"Invalid Opcode for expr type: %s\n",pcVar14);
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/wat-writer.cc"
                    ,0x493,
                    "void wabt::(anonymous namespace)::WatWriter::WriteFoldedExpr(const Expr *)");
    }
    if ((0x24933U >> (uVar15 & 0x1f) & 1) == 0) {
      if ((0x49244U >> (uVar15 & 0x1f) & 1) == 0) goto LAB_00db23d1;
      goto switchD_00db212b_caseD_1;
    }
    goto switchD_00db212b_caseD_0;
  case Throw:
    pVVar5 = cast<wabt::VarExpr<(wabt::ExprType)45>,wabt::Expr>(expr);
    pEVar6 = Module::GetExcept(this->module_,&pVVar5->var);
    if (pEVar6 == (Exception *)0x0) {
      IVar3 = 0;
    }
    else {
      IVar3 = (Index)((ulong)((long)(pEVar6->sig).
                                    super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                             (long)(pEVar6->sig).
                                   super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                                   _M_impl.super__Vector_impl_data._M_start) >> 2);
    }
LAB_00db216c:
    result_count = 0;
    break;
  case Try:
    pTVar9 = cast<wabt::TryExpr,wabt::Expr>(expr);
LAB_00db22ba:
    result_count = (Index)((ulong)((long)*(pointer *)
                                          ((long)&(pTVar9->block).decl.sig.result_types.
                                                  super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>
                                                  ._M_impl.super__Vector_impl_data + 8) -
                                  (long)(pTVar9->block).decl.sig.result_types.
                                        super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                                        _M_impl.super__Vector_impl_data._M_start) >> 2);
    IVar3 = 0;
    break;
  default:
    pcVar14 = GetExprTypeName(expr);
    fprintf(pFVar1,"bad expr type: %s\n",pcVar14);
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/wat-writer.cc"
                  ,0x49e,
                  "void wabt::(anonymous namespace)::WatWriter::WriteFoldedExpr(const Expr *)");
  }
LAB_00db235d:
  PushExpr(this,expr,IVar3,result_count);
  intrusive_list<wabt::Expr>::const_iterator::operator++((const_iterator *)local_48);
  goto LAB_00db20f6;
switchD_00db212b_caseD_0:
  result_count = 1;
  IVar3 = result_count;
  goto LAB_00db235d;
}

Assistant:

void WatWriter::WriteFoldedExprList(const ExprList& exprs) {
  WABT_TRACE(WriteFoldedExprList);
  for (const Expr& expr : exprs) {
    WriteFoldedExpr(&expr);
  }
}